

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

bool tinyusdz::value::Lerp(Value *a,Value *b,double dt,Value *dst)

{
  vtable_type *pvVar1;
  texcoord2f tVar2;
  float2 fVar3;
  bool bVar4;
  half hVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  half2 hVar8;
  texcoord2h tVar9;
  half3 hVar10;
  point3h pVar11;
  vector3h vVar12;
  color3h cVar13;
  normal3h nVar14;
  texcoord3h tVar15;
  half *a_00;
  half *b_00;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *a_01;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *b_01;
  point3d *a_02;
  point3d *b_02;
  vector3f *a_03;
  vector3f *b_03;
  texcoord2f *a_04;
  texcoord2f *b_04;
  array<double,_2UL> *a_05;
  array<double,_2UL> *b_05;
  quatf *a_06;
  quatf *b_06;
  color4f *a_07;
  color4f *b_07;
  vector3d *a_08;
  vector3d *b_08;
  array<tinyusdz::value::half,_4UL> *a_09;
  array<tinyusdz::value::half,_4UL> *b_09;
  normal3d *a_10;
  normal3d *b_10;
  array<float,_2UL> *a_11;
  array<float,_2UL> *b_11;
  array<double,_3UL> *a_12;
  quath *a_13;
  quath *b_12;
  float *pfVar16;
  float *pfVar17;
  double *pdVar18;
  double *pdVar19;
  tinyusdz *ptVar20;
  array<double,_4UL> *a_14;
  array<tinyusdz::value::half,_2UL> *a_15;
  array<tinyusdz::value::half,_2UL> *b_13;
  array<tinyusdz::value::half,_3UL> *a_16;
  array<tinyusdz::value::half,_3UL> *b_14;
  normal3f *a_17;
  normal3f *b_15;
  texcoord2h *a_18;
  texcoord2h *b_16;
  array<float,_4UL> *a_19;
  array<float,_4UL> *b_17;
  point3h *a_20;
  point3h *b_18;
  point3f *a_21;
  point3f *b_19;
  array<float,_3UL> *a_22;
  array<float,_3UL> *b_20;
  quatd *a_23;
  quatd *b_21;
  color3d *a_24;
  color3d *b_22;
  vector3h *a_25;
  vector3h *b_23;
  color4d *a_26;
  color4d *b_24;
  color4h *a_27;
  color4h *b_25;
  color3h *a_28;
  color3h *b_26;
  color3f *a_29;
  color3f *b_27;
  normal3h *a_30;
  normal3h *b_28;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *a_31;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *b_29;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *a_32;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *b_30;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *a_33;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *b_31;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *a_34;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *b_32;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *a_35;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *a_36;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *b_33;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *a_37;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *b_34;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *a_38;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *b_35;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  *a_39;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *a_40;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *b_36;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *a_41;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *a_42;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *a_43;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *b_37;
  vector<float,_std::allocator<float>_> *a_44;
  vector<float,_std::allocator<float>_> *b_38;
  vector<double,_std::allocator<double>_> *a_45;
  vector<double,_std::allocator<double>_> *b_39;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *a_46;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  *a_47;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *a_48;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *a_49;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *b_40;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *a_50;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *b_41;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *a_51;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *a_52;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *b_42;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *a_53;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *b_43;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *a_54;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *a_55;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *b_44;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *a_56;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *b_45;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *a_57;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *b_46;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *a_58;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *b_47;
  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *a_59;
  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *b_48;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *a_60;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *b_49;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *a_61;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *b_50;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *a_62;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *b_51;
  texcoord2d *a_63;
  texcoord2d *b_52;
  texcoord3f *a_64;
  texcoord3f *b_53;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *a_65;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *b_54;
  texcoord3d *a_66;
  texcoord3d *b_55;
  texcoord3h *a_67;
  texcoord3h *b_56;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *a_68;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *b_57;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *a_69;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *b_58;
  long lVar21;
  vector3f vVar22;
  normal3f nVar23;
  point3f pVar24;
  float3 fVar25;
  color3f cVar26;
  texcoord3f tVar27;
  half c;
  undefined1 auStack_76 [14];
  storage_union local_58;
  undefined **local_48;
  _Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> local_40;
  
  if (dst == (Value *)0x0) {
    return false;
  }
  pvVar1 = (a->v_).vtable;
  uVar7 = 2;
  uVar6 = uVar7;
  if (pvVar1 != (vtable_type *)0x0) {
    uVar6 = (*pvVar1->type_id)();
  }
  pvVar1 = (b->v_).vtable;
  if (pvVar1 != (vtable_type *)0x0) {
    uVar7 = (*pvVar1->type_id)();
  }
  if (uVar6 != uVar7) {
    return false;
  }
  pvVar1 = (a->v_).vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    uVar6 = 2;
  }
  else {
    uVar6 = (*pvVar1->type_id)();
  }
  bVar4 = IsLerpSupportedType(uVar6);
  if (!bVar4) {
    return false;
  }
  local_48 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_58.dynamic = (void *)0x0;
  if (uVar6 - 0xe < 0x3d) {
    lVar21 = (long)&switchD_0021d5af::switchdataD_002f45e8 +
             (long)(int)(&switchD_0021d5af::switchdataD_002f45e8)[uVar6 - 0xe];
    switch(uVar6) {
    case 0xe:
      a_00 = Value::as<tinyusdz::value::half>(a,false);
      b_00 = Value::as<tinyusdz::value::half>(b,false);
      if (b_00 != (half *)0x0 && a_00 != (half *)0x0) {
        hVar5 = lerp<tinyusdz::value::half>(a_00,b_00,dt);
        c.value = hVar5.value;
        linb::any::operator=((any *)&local_58,&c);
        goto LAB_0021f247;
      }
      break;
    default:
      goto LAB_0021f435;
    case 0x11:
      a_15 = Value::as<std::array<tinyusdz::value::half,2ul>>(a,false);
      b_13 = Value::as<std::array<tinyusdz::value::half,2ul>>(b,false);
      if (b_13 != (array<tinyusdz::value::half,_2UL> *)0x0 &&
          a_15 != (array<tinyusdz::value::half,_2UL> *)0x0) {
        hVar8 = lerp<std::array<tinyusdz::value::half,2ul>>(a_15,b_13,dt);
        _c = (float)hVar8._M_elems;
        linb::any::operator=((any *)&local_58,(array<tinyusdz::value::half,_2UL> *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x12:
      a_16 = Value::as<std::array<tinyusdz::value::half,3ul>>(a,false);
      b_14 = Value::as<std::array<tinyusdz::value::half,3ul>>(b,false);
      if (b_14 != (array<tinyusdz::value::half,_3UL> *)0x0 &&
          a_16 != (array<tinyusdz::value::half,_3UL> *)0x0) {
        hVar10 = lerp<std::array<tinyusdz::value::half,3ul>>(a_16,b_14,dt);
        _c = hVar10._M_elems;
        linb::any::operator=((any *)&local_58,(array<tinyusdz::value::half,_3UL> *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x13:
      a_09 = Value::as<std::array<tinyusdz::value::half,4ul>>(a,false);
      b_09 = Value::as<std::array<tinyusdz::value::half,4ul>>(b,false);
      if (b_09 != (array<tinyusdz::value::half,_4UL> *)0x0 &&
          a_09 != (array<tinyusdz::value::half,_4UL> *)0x0) {
        _c = (color4h)lerp<std::array<tinyusdz::value::half,4ul>>(a_09,b_09,dt);
        linb::any::operator=((any *)&local_58,(array<tinyusdz::value::half,_4UL> *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x28:
      pfVar16 = Value::as<float>(a,false);
      pfVar17 = Value::as<float>(b,false);
      if (pfVar17 != (float *)0x0 && pfVar16 != (float *)0x0) {
        _c = (float)(1.0 - dt) * *pfVar16 + (float)dt * *pfVar17;
        linb::any::operator=((any *)&local_58,(float *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x29:
      a_11 = Value::as<std::array<float,2ul>>(a,false);
      b_11 = Value::as<std::array<float,2ul>>(b,false);
      if (b_11 != (array<float,_2UL> *)0x0 && a_11 != (array<float,_2UL> *)0x0) {
        fVar3 = lerp<std::array<float,2ul>>(a_11,b_11,dt);
        _c = fVar3._M_elems[0];
        auStack_76._2_4_ = fVar3._M_elems[1];
        linb::any::operator=((any *)&local_58,(array<float,_2UL> *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x2a:
      a_22 = Value::as<std::array<float,3ul>>(a,false);
      b_20 = Value::as<std::array<float,3ul>>(b,false);
      if (b_20 != (array<float,_3UL> *)0x0 && a_22 != (array<float,_3UL> *)0x0) {
        fVar25 = lerp<std::array<float,3ul>>(a_22,b_20,dt);
        _c = fVar25._M_elems[0];
        auStack_76._2_4_ = fVar25._M_elems[1];
        auStack_76._6_4_ = fVar25._M_elems[2];
        linb::any::operator=((any *)&local_58,(array<float,_3UL> *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x2b:
      a_19 = Value::as<std::array<float,4ul>>(a,false);
      b_17 = Value::as<std::array<float,4ul>>(b,false);
      if (b_17 != (array<float,_4UL> *)0x0 && a_19 != (array<float,_4UL> *)0x0) {
        _c = (color4f)lerp<std::array<float,4ul>>(a_19,b_17,dt);
        linb::any::operator=((any *)&local_58,(array<float,_4UL> *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x2c:
      pdVar18 = Value::as<double>(a,false);
      pdVar19 = Value::as<double>(b,false);
      if (pdVar19 != (double *)0x0 && pdVar18 != (double *)0x0) {
        _c = (color4h)((1.0 - dt) * *pdVar18 + dt * *pdVar19);
        linb::any::operator=((any *)&local_58,(double *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x2d:
      a_05 = Value::as<std::array<double,2ul>>(a,false);
      b_05 = Value::as<std::array<double,2ul>>(b,false);
      if (b_05 != (array<double,_2UL> *)0x0 && a_05 != (array<double,_2UL> *)0x0) {
        _c = (color4f)lerp<std::array<double,2ul>>(a_05,b_05,dt);
        linb::any::operator=((any *)&local_58,(array<double,_2UL> *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x2e:
      ptVar20 = (tinyusdz *)Value::as<std::array<double,3ul>>(a,false);
      a_12 = Value::as<std::array<double,3ul>>(b,false);
      if (a_12 != (array<double,_3UL> *)0x0 && ptVar20 != (tinyusdz *)0x0) {
        lerp<std::array<double,3ul>>
                  ((double3 *)&c,ptVar20,a_12,
                   (double3 *)CONCAT71((int7)((ulong)lVar21 >> 8),ptVar20 == (tinyusdz *)0x0),dt);
        linb::any::operator=((any *)&local_58,(double3 *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x2f:
      ptVar20 = (tinyusdz *)Value::as<std::array<double,4ul>>(a,false);
      a_14 = Value::as<std::array<double,4ul>>(b,false);
      if (a_14 != (array<double,_4UL> *)0x0 && ptVar20 != (tinyusdz *)0x0) {
        lerp<std::array<double,4ul>>
                  ((double4 *)&c,ptVar20,a_14,
                   (double4 *)CONCAT71((int7)((ulong)lVar21 >> 8),ptVar20 == (tinyusdz *)0x0),dt);
        linb::any::operator=((any *)&local_58,(double4 *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x30:
      a_13 = Value::as<tinyusdz::value::quath>(a,false);
      b_12 = Value::as<tinyusdz::value::quath>(b,false);
      if (b_12 != (quath *)0x0 && a_13 != (quath *)0x0) {
        _c = (color4h)lerp<tinyusdz::value::quath>(a_13,b_12,dt);
        linb::any::operator=((any *)&local_58,(quath *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x31:
      a_06 = Value::as<tinyusdz::value::quatf>(a,false);
      b_06 = Value::as<tinyusdz::value::quatf>(b,false);
      if (b_06 != (quatf *)0x0 && a_06 != (quatf *)0x0) {
        _c = (color4f)lerp<tinyusdz::value::quatf>(a_06,b_06,dt);
        linb::any::operator=((any *)&local_58,(quatf *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x32:
      a_23 = Value::as<tinyusdz::value::quatd>(a,false);
      b_21 = Value::as<tinyusdz::value::quatd>(b,false);
      if (b_21 != (quatd *)0x0 && a_23 != (quatd *)0x0) {
        slerp((quatd *)&c,a_23,b_21,dt);
        linb::any::operator=((any *)&local_58,(quatd *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x39:
      a_28 = Value::as<tinyusdz::value::color3h>(a,false);
      b_26 = Value::as<tinyusdz::value::color3h>(b,false);
      if (b_26 != (color3h *)0x0 && a_28 != (color3h *)0x0) {
        cVar13 = lerp<tinyusdz::value::color3h>(a_28,b_26,dt);
        _c = cVar13;
        linb::any::operator=((any *)&local_58,(color3h *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x3a:
      a_29 = Value::as<tinyusdz::value::color3f>(a,false);
      b_27 = Value::as<tinyusdz::value::color3f>(b,false);
      if (b_27 != (color3f *)0x0 && a_29 != (color3f *)0x0) {
        cVar26 = lerp<tinyusdz::value::color3f>(a_29,b_27,dt);
        _c = cVar26.r;
        auStack_76._2_4_ = cVar26.g;
        auStack_76._6_4_ = cVar26.b;
        linb::any::operator=((any *)&local_58,(color3f *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x3b:
      a_24 = Value::as<tinyusdz::value::color3d>(a,false);
      b_22 = Value::as<tinyusdz::value::color3d>(b,false);
      if (b_22 != (color3d *)0x0 && a_24 != (color3d *)0x0) {
        lerp<tinyusdz::value::color3d>((color3d *)&c,a_24,b_22,dt);
        linb::any::operator=((any *)&local_58,(color3d *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x3c:
      a_27 = Value::as<tinyusdz::value::color4h>(a,false);
      b_25 = Value::as<tinyusdz::value::color4h>(b,false);
      if (b_25 != (color4h *)0x0 && a_27 != (color4h *)0x0) {
        _c = lerp<tinyusdz::value::color4h>(a_27,b_25,dt);
        linb::any::operator=((any *)&local_58,(color4h *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x3d:
      a_07 = Value::as<tinyusdz::value::color4f>(a,false);
      b_07 = Value::as<tinyusdz::value::color4f>(b,false);
      if (b_07 != (color4f *)0x0 && a_07 != (color4f *)0x0) {
        _c = lerp<tinyusdz::value::color4f>(a_07,b_07,dt);
        linb::any::operator=((any *)&local_58,(color4f *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x3e:
      a_26 = Value::as<tinyusdz::value::color4d>(a,false);
      b_24 = Value::as<tinyusdz::value::color4d>(b,false);
      if (b_24 != (color4d *)0x0 && a_26 != (color4d *)0x0) {
        lerp<tinyusdz::value::color4d>((color4d *)&c,a_26,b_24,dt);
        linb::any::operator=((any *)&local_58,(color4d *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x3f:
      a_20 = Value::as<tinyusdz::value::point3h>(a,false);
      b_18 = Value::as<tinyusdz::value::point3h>(b,false);
      if (b_18 != (point3h *)0x0 && a_20 != (point3h *)0x0) {
        pVar11 = lerp<tinyusdz::value::point3h>(a_20,b_18,dt);
        _c = pVar11;
        linb::any::operator=((any *)&local_58,(point3h *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x40:
      a_21 = Value::as<tinyusdz::value::point3f>(a,false);
      b_19 = Value::as<tinyusdz::value::point3f>(b,false);
      if (b_19 != (point3f *)0x0 && a_21 != (point3f *)0x0) {
        pVar24 = lerp<tinyusdz::value::point3f>(a_21,b_19,dt);
        _c = pVar24.x;
        auStack_76._2_4_ = pVar24.y;
        auStack_76._6_4_ = pVar24.z;
        linb::any::operator=((any *)&local_58,(point3f *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x41:
      a_02 = Value::as<tinyusdz::value::point3d>(a,false);
      b_02 = Value::as<tinyusdz::value::point3d>(b,false);
      if (b_02 != (point3d *)0x0 && a_02 != (point3d *)0x0) {
        lerp<tinyusdz::value::point3d>((point3d *)&c,a_02,b_02,dt);
        linb::any::operator=((any *)&local_58,(point3d *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x42:
      a_30 = Value::as<tinyusdz::value::normal3h>(a,false);
      b_28 = Value::as<tinyusdz::value::normal3h>(b,false);
      if (b_28 != (normal3h *)0x0 && a_30 != (normal3h *)0x0) {
        nVar14 = lerp<tinyusdz::value::normal3h>(a_30,b_28,dt);
        _c = nVar14;
        linb::any::operator=((any *)&local_58,(normal3h *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x43:
      a_17 = Value::as<tinyusdz::value::normal3f>(a,false);
      b_15 = Value::as<tinyusdz::value::normal3f>(b,false);
      if (b_15 != (normal3f *)0x0 && a_17 != (normal3f *)0x0) {
        nVar23 = lerp<tinyusdz::value::normal3f>(a_17,b_15,dt);
        _c = nVar23.x;
        auStack_76._2_4_ = nVar23.y;
        auStack_76._6_4_ = nVar23.z;
        linb::any::operator=((any *)&local_58,(normal3f *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x44:
      a_10 = Value::as<tinyusdz::value::normal3d>(a,false);
      b_10 = Value::as<tinyusdz::value::normal3d>(b,false);
      if (b_10 != (normal3d *)0x0 && a_10 != (normal3d *)0x0) {
        lerp<tinyusdz::value::normal3d>((normal3d *)&c,a_10,b_10,dt);
        linb::any::operator=((any *)&local_58,(normal3d *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x45:
      a_25 = Value::as<tinyusdz::value::vector3h>(a,false);
      b_23 = Value::as<tinyusdz::value::vector3h>(b,false);
      if (b_23 != (vector3h *)0x0 && a_25 != (vector3h *)0x0) {
        vVar12 = lerp<tinyusdz::value::vector3h>(a_25,b_23,dt);
        _c = vVar12;
        linb::any::operator=((any *)&local_58,(vector3h *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x46:
      a_03 = Value::as<tinyusdz::value::vector3f>(a,false);
      b_03 = Value::as<tinyusdz::value::vector3f>(b,false);
      if (b_03 != (vector3f *)0x0 && a_03 != (vector3f *)0x0) {
        vVar22 = lerp<tinyusdz::value::vector3f>(a_03,b_03,dt);
        _c = vVar22.x;
        auStack_76._2_4_ = vVar22.y;
        auStack_76._6_4_ = vVar22.z;
        linb::any::operator=((any *)&local_58,(vector3f *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x47:
      a_08 = Value::as<tinyusdz::value::vector3d>(a,false);
      b_08 = Value::as<tinyusdz::value::vector3d>(b,false);
      if (b_08 != (vector3d *)0x0 && a_08 != (vector3d *)0x0) {
        lerp<tinyusdz::value::vector3d>((vector3d *)&c,a_08,b_08,dt);
        linb::any::operator=((any *)&local_58,(vector3d *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x49:
      a_18 = Value::as<tinyusdz::value::texcoord2h>(a,false);
      b_16 = Value::as<tinyusdz::value::texcoord2h>(b,false);
      if (b_16 != (texcoord2h *)0x0 && a_18 != (texcoord2h *)0x0) {
        tVar9 = lerp<tinyusdz::value::texcoord2h>(a_18,b_16,dt);
        _c = (float)tVar9;
        linb::any::operator=((any *)&local_58,(texcoord2h *)&c);
        goto LAB_0021f247;
      }
      break;
    case 0x4a:
      a_04 = Value::as<tinyusdz::value::texcoord2f>(a,false);
      b_04 = Value::as<tinyusdz::value::texcoord2f>(b,false);
      if (b_04 != (texcoord2f *)0x0 && a_04 != (texcoord2f *)0x0) {
        tVar2 = lerp<tinyusdz::value::texcoord2f>(a_04,b_04,dt);
        _c = tVar2.s;
        auStack_76._2_4_ = tVar2.t;
        linb::any::operator=((any *)&local_58,(texcoord2f *)&c);
        goto LAB_0021f247;
      }
    }
    goto LAB_0021f418;
  }
  if (uVar6 - 0x10000e < 0x3d) {
    lVar21 = (long)&switchD_0021d634::switchdataD_002f46dc +
             (long)(int)(&switchD_0021d634::switchdataD_002f46dc)[uVar6 - 0x10000e];
    switch(uVar6) {
    case 0x10000e:
      a_01 = Value::as<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                       (a,false);
      b_01 = Value::as<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_01 != (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0 &&
          a_01 != (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0) {
        lerp<tinyusdz::value::half>
                  ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   &local_40,a_01,b_01,dt);
        ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::_M_move_assign
                  ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)&c,
                   &local_40);
        ::std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *
                      )&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)&c);
        ::std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *
                      )&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                    &c);
      break;
    default:
      goto LAB_0021f435;
    case 0x100011:
      ptVar20 = (tinyusdz *)
                Value::
                as<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                          (a,false);
      a_47 = Value::
             as<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (a_47 != (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                   *)0x0 && ptVar20 != (tinyusdz *)0x0) {
        lerp<std::array<tinyusdz::value::half,2ul>>
                  ((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)&local_40,ptVar20,a_47,
                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)CONCAT71((int7)((ulong)lVar21 >> 8),ptVar20 == (tinyusdz *)0x0),dt);
        ::std::
        vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
        ::_M_move_assign((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                          *)&c,&local_40);
        ::std::
        _Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
        ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                         *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)&c);
        ::std::
        _Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
        ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                         *)&c);
        goto LAB_0021f247;
      }
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                       *)&c);
      break;
    case 0x100012:
      ptVar20 = (tinyusdz *)
                Value::
                as<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                          (a,false);
      a_48 = Value::
             as<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (a_48 != (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)0x0 && ptVar20 != (tinyusdz *)0x0) {
        lerp<std::array<tinyusdz::value::half,3ul>>
                  ((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)&local_40,ptVar20,a_48,
                   (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)CONCAT71((int7)((ulong)lVar21 >> 8),ptVar20 == (tinyusdz *)0x0),dt);
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::_M_move_assign((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          *)&c,&local_40);
        ::std::
        _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)&c);
        ::std::
        _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&c);
        goto LAB_0021f247;
      }
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       *)&c);
      break;
    case 0x100013:
      ptVar20 = (tinyusdz *)
                Value::
                as<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                          (a,false);
      a_39 = Value::
             as<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (a_39 != (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                   *)0x0 && ptVar20 != (tinyusdz *)0x0) {
        lerp<std::array<tinyusdz::value::half,4ul>>
                  ((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)&local_40,ptVar20,a_39,
                   (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)CONCAT71((int7)((ulong)lVar21 >> 8),ptVar20 == (tinyusdz *)0x0),dt);
        ::std::
        vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
        ::_M_move_assign((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                          *)&c,&local_40);
        ::std::
        _Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
        ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                         *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)&c);
        ::std::
        _Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
        ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                         *)&c);
        goto LAB_0021f247;
      }
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                       *)&c);
      break;
    case 0x100028:
      a_44 = Value::as<std::vector<float,std::allocator<float>>>(a,false);
      b_38 = Value::as<std::vector<float,std::allocator<float>>>(b,false);
      _c = (color4f)ZEXT816(0);
      if (b_38 != (vector<float,_std::allocator<float>_> *)0x0 &&
          a_44 != (vector<float,_std::allocator<float>_> *)0x0) {
        lerp<float>((vector<float,_std::allocator<float>_> *)&local_40,a_44,b_38,dt);
        ::std::vector<float,_std::allocator<float>_>::_M_move_assign
                  ((vector<float,_std::allocator<float>_> *)&c,&local_40);
        ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&local_40);
        linb::any::operator=((any *)&local_58,(vector<float,_std::allocator<float>_> *)&c);
        ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&c);
      break;
    case 0x100029:
      ptVar20 = (tinyusdz *)
                Value::as<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                          (a,false);
      a_41 = Value::as<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (a_41 != (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)0x0 &&
          ptVar20 != (tinyusdz *)0x0) {
        lerp<std::array<float,2ul>>
                  ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   &local_40,ptVar20,a_41,
                   (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   CONCAT71((int7)((ulong)lVar21 >> 8),ptVar20 == (tinyusdz *)0x0),dt);
        ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
        _M_move_assign((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                       &c,&local_40);
        ::std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)&c);
        ::std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     *)&c);
      break;
    case 0x10002a:
      ptVar20 = (tinyusdz *)
                Value::as<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                          (a,false);
      a_54 = Value::as<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (a_54 != (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0 &&
          ptVar20 != (tinyusdz *)0x0) {
        lerp<std::array<float,3ul>>
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &local_40,ptVar20,a_54,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   CONCAT71((int7)((ulong)lVar21 >> 8),ptVar20 == (tinyusdz *)0x0),dt);
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
        _M_move_assign((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &c,&local_40);
        ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)&c);
        ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     *)&c);
      break;
    case 0x10002b:
      ptVar20 = (tinyusdz *)
                Value::as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                          (a,false);
      a_51 = Value::as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (a_51 != (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)0x0 &&
          ptVar20 != (tinyusdz *)0x0) {
        lerp<std::array<float,4ul>>
                  ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   &local_40,ptVar20,a_51,
                   (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   CONCAT71((int7)((ulong)lVar21 >> 8),ptVar20 == (tinyusdz *)0x0),dt);
        ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
        _M_move_assign((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                       &c,&local_40);
        ::std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)&c);
        ::std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                     *)&c);
      break;
    case 0x10002c:
      a_45 = Value::as<std::vector<double,std::allocator<double>>>(a,false);
      b_39 = Value::as<std::vector<double,std::allocator<double>>>(b,false);
      _c = (color4f)ZEXT816(0);
      if (b_39 != (vector<double,_std::allocator<double>_> *)0x0 &&
          a_45 != (vector<double,_std::allocator<double>_> *)0x0) {
        lerp<double>((vector<double,_std::allocator<double>_> *)&local_40,a_45,b_39,dt);
        ::std::vector<double,_std::allocator<double>_>::_M_move_assign
                  ((vector<double,_std::allocator<double>_> *)&c,&local_40);
        ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&local_40);
        linb::any::operator=((any *)&local_58,(vector<double,_std::allocator<double>_> *)&c);
        ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&c);
      break;
    case 0x10002d:
      ptVar20 = (tinyusdz *)
                Value::
                as<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                          (a,false);
      a_35 = Value::as<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (a_35 != (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x0
          && ptVar20 != (tinyusdz *)0x0) {
        lerp<std::array<double,2ul>>
                  ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &local_40,ptVar20,a_35,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   CONCAT71((int7)((ulong)lVar21 >> 8),ptVar20 == (tinyusdz *)0x0),dt);
        ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
        _M_move_assign((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )&c,&local_40);
        ::std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)&c)
        ;
        ::std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                     *)&c);
      break;
    case 0x10002e:
      ptVar20 = (tinyusdz *)
                Value::
                as<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                          (a,false);
      a_42 = Value::as<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (a_42 != (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)0x0
          && ptVar20 != (tinyusdz *)0x0) {
        lerp<std::array<double,3ul>>
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &local_40,ptVar20,a_42,
                   (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   CONCAT71((int7)((ulong)lVar21 >> 8),ptVar20 == (tinyusdz *)0x0),dt);
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
        _M_move_assign((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *
                       )&c,&local_40);
        ::std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)&c)
        ;
        ::std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     *)&c);
      break;
    case 0x10002f:
      ptVar20 = (tinyusdz *)
                Value::
                as<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                          (a,false);
      a_46 = Value::as<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (a_46 != (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)0x0
          && ptVar20 != (tinyusdz *)0x0) {
        lerp<std::array<double,4ul>>
                  ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &local_40,ptVar20,a_46,
                   (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   CONCAT71((int7)((ulong)lVar21 >> 8),ptVar20 == (tinyusdz *)0x0),dt);
        ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
        _M_move_assign((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *
                       )&c,&local_40);
        ::std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)&c)
        ;
        ::std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     *)&c);
      break;
    case 0x100030:
      a_43 = Value::as<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                       (a,false);
      b_37 = Value::as<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_37 != (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)0x0 &&
          a_43 != (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)0x0) {
        lerp<tinyusdz::value::quath>
                  ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   &local_40,a_43,b_37,dt);
        ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::
        _M_move_assign((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)&c
                       ,&local_40);
        ::std::_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)&c);
        ::std::_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *
                    )&c);
      break;
    case 0x100031:
      a_36 = Value::as<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                       (a,false);
      b_33 = Value::as<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_33 != (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0 &&
          a_36 != (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0) {
        lerp<tinyusdz::value::quatf>
                  ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &local_40,a_36,b_33,dt);
        ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
        _M_move_assign((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)&c
                       ,&local_40);
        ::std::_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)&c);
        ::std::_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *
                    )&c);
      break;
    case 0x100032:
      a_55 = Value::as<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                       (a,false);
      b_44 = Value::as<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_44 != (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)0x0 &&
          a_55 != (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)0x0) {
        lerp<tinyusdz::value::quatd>
                  ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                   &local_40,a_55,b_44,dt);
        ::std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
        _M_move_assign((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)&c
                       ,&local_40);
        ::std::_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)&c);
        ::std::_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *
                    )&c);
      break;
    case 0x100039:
      a_60 = Value::
             as<std::vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>>>
                       (a,false);
      b_49 = Value::
             as<std::vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_49 != (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)0x0
          && a_60 != (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                     0x0) {
        lerp<tinyusdz::value::color3h>
                  ((vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                   &local_40,a_60,b_49,dt);
        ::std::vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::
        _M_move_assign((vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)&c
                  );
        ::std::_Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                     *)&c);
      break;
    case 0x10003a:
      a_61 = Value::
             as<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                       (a,false);
      b_50 = Value::
             as<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_50 != (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)0x0
          && a_61 != (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                     0x0) {
        lerp<tinyusdz::value::color3f>
                  ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   &local_40,a_61,b_50,dt);
        ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
        _M_move_assign((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)&c
                  );
        ::std::_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                     *)&c);
      break;
    case 0x10003b:
      a_56 = Value::
             as<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                       (a,false);
      b_45 = Value::
             as<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_45 != (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)0x0
          && a_56 != (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                     0x0) {
        lerp<tinyusdz::value::color3d>
                  ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &local_40,a_56,b_45,dt);
        ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
        _M_move_assign((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)&c
                  );
        ::std::_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                     *)&c);
      break;
    case 0x10003c:
      a_59 = Value::
             as<std::vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>>>
                       (a,false);
      b_48 = Value::
             as<std::vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_48 != (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)0x0
          && a_59 != (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                     0x0) {
        lerp<tinyusdz::value::color4h>
                  ((vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                   &local_40,a_59,b_48,dt);
        ::std::vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>::
        _M_move_assign((vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)&c
                  );
        ::std::_Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                     *)&c);
      break;
    case 0x10003d:
      a_37 = Value::
             as<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                       (a,false);
      b_34 = Value::
             as<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_34 != (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)0x0
          && a_37 != (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                     0x0) {
        lerp<tinyusdz::value::color4f>
                  ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   &local_40,a_37,b_34,dt);
        ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
        _M_move_assign((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)&c
                  );
        ::std::_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                     *)&c);
      break;
    case 0x10003e:
      a_58 = Value::
             as<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                       (a,false);
      b_47 = Value::
             as<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_47 != (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)0x0
          && a_58 != (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                     0x0) {
        lerp<tinyusdz::value::color4d>
                  ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   &local_40,a_58,b_47,dt);
        ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
        _M_move_assign((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
        ~_Vector_base(&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)&c
                  );
        ::std::_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                     *)&c);
      break;
    case 0x10003f:
      a_52 = Value::
             as<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                       (a,false);
      b_42 = Value::
             as<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_42 != (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)0x0
          && a_52 != (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                     0x0) {
        lerp<tinyusdz::value::point3h>
                  ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   &local_40,a_52,b_42,dt);
        ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
        _M_move_assign((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)&c
                  );
        ::std::_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                     *)&c);
      break;
    case 0x100040:
      a_53 = Value::
             as<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                       (a,false);
      b_43 = Value::
             as<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_43 != (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)0x0
          && a_53 != (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                     0x0) {
        lerp<tinyusdz::value::point3f>
                  ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   &local_40,a_53,b_43,dt);
        ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
        _M_move_assign((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)&c
                  );
        ::std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                     *)&c);
      break;
    case 0x100041:
      a_32 = Value::
             as<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                       (a,false);
      b_30 = Value::
             as<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_30 != (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)0x0
          && a_32 != (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                     0x0) {
        lerp<tinyusdz::value::point3d>
                  ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &local_40,a_32,b_30,dt);
        ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
        _M_move_assign((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)&c
                  );
        ::std::_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                     *)&c);
      break;
    case 0x100042:
      a_62 = Value::
             as<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                       (a,false);
      b_51 = Value::
             as<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_51 != (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                  0x0 &&
          a_62 != (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                  0x0) {
        lerp<tinyusdz::value::normal3h>
                  ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   &local_40,a_62,b_51,dt);
        ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
        _M_move_assign((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   &c);
        ::std::_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                     *)&c);
      break;
    case 0x100043:
      a_49 = Value::
             as<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                       (a,false);
      b_40 = Value::
             as<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_40 != (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                  0x0 &&
          a_49 != (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                  0x0) {
        lerp<tinyusdz::value::normal3f>
                  ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &local_40,a_49,b_40,dt);
        ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
        _M_move_assign((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &c);
        ::std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                     *)&c);
      break;
    case 0x100044:
      a_40 = Value::
             as<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                       (a,false);
      b_36 = Value::
             as<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_36 != (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                  0x0 &&
          a_40 != (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                  0x0) {
        lerp<tinyusdz::value::normal3d>
                  ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &local_40,a_40,b_36,dt);
        ::std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
        _M_move_assign((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &c);
        ::std::_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                     *)&c);
      break;
    case 0x100045:
      a_57 = Value::
             as<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                       (a,false);
      b_46 = Value::
             as<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_46 != (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                  0x0 &&
          a_57 != (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                  0x0) {
        lerp<tinyusdz::value::vector3h>
                  ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   &local_40,a_57,b_46,dt);
        ::std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
        _M_move_assign((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   &c);
        ::std::_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                     *)&c);
      break;
    case 0x100046:
      a_33 = Value::
             as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                       (a,false);
      b_31 = Value::
             as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_31 != (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                  0x0 &&
          a_33 != (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                  0x0) {
        lerp<tinyusdz::value::vector3f>
                  ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &local_40,a_33,b_31,dt);
        ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
        _M_move_assign((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &c);
        ::std::_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                     *)&c);
      break;
    case 0x100047:
      a_38 = Value::
             as<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                       (a,false);
      b_35 = Value::
             as<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_35 != (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                  0x0 &&
          a_38 != (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                  0x0) {
        lerp<tinyusdz::value::vector3d>
                  ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &local_40,a_38,b_35,dt);
        ::std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
        _M_move_assign((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                        *)&c,&local_40);
        ::std::_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &c);
        ::std::_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                     *)&c);
      break;
    case 0x100049:
      a_50 = Value::
             as<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                       (a,false);
      b_41 = Value::
             as<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_41 != (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                   *)0x0 &&
          a_50 != (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                   *)0x0) {
        lerp<tinyusdz::value::texcoord2h>
                  ((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                    *)&local_40,a_50,b_41,dt);
        ::std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
        _M_move_assign((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                        *)&c,&local_40);
        ::std::
        _Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                    *)&c);
        ::std::
        _Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                       *)&c);
      break;
    case 0x10004a:
      a_34 = Value::
             as<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                       (a,false);
      b_32 = Value::
             as<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_32 != (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                   *)0x0 &&
          a_34 != (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                   *)0x0) {
        lerp<tinyusdz::value::texcoord2f>
                  ((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    *)&local_40,a_34,b_32,dt);
        ::std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        _M_move_assign((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                        *)&c,&local_40);
        ::std::
        _Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    *)&c);
        ::std::
        _Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)&c);
    }
    goto LAB_0021f418;
  }
LAB_0021f435:
  switch(uVar6) {
  case 0x4b:
    a_63 = Value::as<tinyusdz::value::texcoord2d>(a,false);
    b_52 = Value::as<tinyusdz::value::texcoord2d>(b,false);
    if (b_52 == (texcoord2d *)0x0 || a_63 == (texcoord2d *)0x0) break;
    _c = (color4f)lerp<tinyusdz::value::texcoord2d>(a_63,b_52,dt);
    linb::any::operator=((any *)&local_58,(texcoord2d *)&c);
LAB_0021f247:
    linb::any::operator=(&dst->v_,(any *)&local_58);
    bVar4 = true;
    goto LAB_0021f41a;
  case 0x4c:
    a_67 = Value::as<tinyusdz::value::texcoord3h>(a,false);
    b_56 = Value::as<tinyusdz::value::texcoord3h>(b,false);
    if (b_56 != (texcoord3h *)0x0 && a_67 != (texcoord3h *)0x0) {
      tVar15 = lerp<tinyusdz::value::texcoord3h>(a_67,b_56,dt);
      _c = tVar15;
      linb::any::operator=((any *)&local_58,(texcoord3h *)&c);
      goto LAB_0021f247;
    }
    break;
  case 0x4d:
    a_64 = Value::as<tinyusdz::value::texcoord3f>(a,false);
    b_53 = Value::as<tinyusdz::value::texcoord3f>(b,false);
    if (b_53 != (texcoord3f *)0x0 && a_64 != (texcoord3f *)0x0) {
      tVar27 = lerp<tinyusdz::value::texcoord3f>(a_64,b_53,dt);
      _c = tVar27.s;
      auStack_76._2_4_ = tVar27.t;
      auStack_76._6_4_ = tVar27.r;
      linb::any::operator=((any *)&local_58,(texcoord3f *)&c);
      goto LAB_0021f247;
    }
    break;
  case 0x4e:
    a_66 = Value::as<tinyusdz::value::texcoord3d>(a,false);
    b_55 = Value::as<tinyusdz::value::texcoord3d>(b,false);
    if (b_55 != (texcoord3d *)0x0 && a_66 != (texcoord3d *)0x0) {
      lerp<tinyusdz::value::texcoord3d>((texcoord3d *)&c,a_66,b_55,dt);
      linb::any::operator=((any *)&local_58,(texcoord3d *)&c);
      goto LAB_0021f247;
    }
    break;
  default:
    switch(uVar6) {
    case 0x10004b:
      a_31 = Value::
             as<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                       (a,false);
      b_29 = Value::
             as<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_29 != (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                   *)0x0 &&
          a_31 != (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                   *)0x0) {
        lerp<tinyusdz::value::texcoord2d>
                  ((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                    *)&local_40,a_31,b_29,dt);
        ::std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
        _M_move_assign((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                        *)&c,&local_40);
        ::std::
        _Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                    *)&c);
        ::std::
        _Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                       *)&c);
      break;
    case 0x10004c:
      a_69 = Value::
             as<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                       (a,false);
      b_58 = Value::
             as<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_58 != (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                   *)0x0 &&
          a_69 != (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                   *)0x0) {
        lerp<tinyusdz::value::texcoord3h>
                  ((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                    *)&local_40,a_69,b_58,dt);
        ::std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
        _M_move_assign((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                        *)&c,&local_40);
        ::std::
        _Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                    *)&c);
        ::std::
        _Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                       *)&c);
      break;
    case 0x10004d:
      a_65 = Value::
             as<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                       (a,false);
      b_54 = Value::
             as<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_54 != (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                   *)0x0 &&
          a_65 != (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                   *)0x0) {
        lerp<tinyusdz::value::texcoord3f>
                  ((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                    *)&local_40,a_65,b_54,dt);
        ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
        _M_move_assign((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                        *)&c,&local_40);
        ::std::
        _Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                    *)&c);
        ::std::
        _Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       *)&c);
      break;
    case 0x10004e:
      a_68 = Value::
             as<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                       (a,false);
      b_57 = Value::
             as<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                       (b,false);
      _c = (color4f)ZEXT816(0);
      if (b_57 != (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                   *)0x0 &&
          a_68 != (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                   *)0x0) {
        lerp<tinyusdz::value::texcoord3d>
                  ((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                    *)&local_40,a_68,b_57,dt);
        ::std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
        _M_move_assign((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                        *)&c,&local_40);
        ::std::
        _Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                       *)&local_40);
        linb::any::operator=
                  ((any *)&local_58,
                   (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                    *)&c);
        ::std::
        _Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                       *)&c);
        goto LAB_0021f247;
      }
      ::std::_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                       *)&c);
      break;
    default:
      bVar4 = false;
      goto LAB_0021f428;
    }
  }
LAB_0021f418:
  bVar4 = false;
LAB_0021f41a:
  if (local_48 != (undefined **)0x0) {
LAB_0021f428:
    (*(code *)local_48[4])(&local_58);
  }
  return bVar4;
}

Assistant:

bool Lerp(const value::Value &a, const value::Value &b, double dt, value::Value *dst) {
  if (!dst) {
    return false;
  }

  if (a.type_id() != b.type_id()) {
    return false;
  }

  uint32_t tyid = a.type_id();

  if (!IsLerpSupportedType(tyid)) {
    return false;
  }

  bool ok{false};
  value::Value result;

#define DO_LERP(__ty) \
  if (tyid == value::TypeTraits<__ty>::type_id()) { \
    const __ty *v0 = a.as<__ty>(); \
    const __ty *v1 = b.as<__ty>(); \
    __ty c; \
    if (v0 && v1) { \
      c = lerp(*v0, *v1, dt); \
      result = c; \
      ok = true; \
    } \
  } else if (tyid == value::TypeTraits<std::vector<__ty>>::type_id()) { \
    const std::vector<__ty> *v0 = a.as<std::vector<__ty>>(); \
    const std::vector<__ty> *v1 = b.as<std::vector<__ty>>(); \
    std::vector<__ty> c; \
    if (v0 && v1) { \
      c = lerp(*v0, *v1, dt); \
      result = c; \
      ok = true; \
    } \
  } else

  DO_LERP(value::half)
  DO_LERP(value::half2)
  DO_LERP(value::half3)
  DO_LERP(value::half4)
  DO_LERP(float)
  DO_LERP(value::float2)
  DO_LERP(value::float3)
  DO_LERP(value::float4)
  DO_LERP(double)
  DO_LERP(value::double2)
  DO_LERP(value::double3)
  DO_LERP(value::double4)
  DO_LERP(value::quath)
  DO_LERP(value::quatf)
  DO_LERP(value::quatd)
  DO_LERP(value::color3h)
  DO_LERP(value::color3f)
  DO_LERP(value::color3d)
  DO_LERP(value::color4h)
  DO_LERP(value::color4f)
  DO_LERP(value::color4d)
  DO_LERP(value::point3h)
  DO_LERP(value::point3f)
  DO_LERP(value::point3d)
  DO_LERP(value::normal3h)
  DO_LERP(value::normal3f)
  DO_LERP(value::normal3d)
  DO_LERP(value::vector3h)
  DO_LERP(value::vector3f)
  DO_LERP(value::vector3d)
  DO_LERP(value::texcoord2h)
  DO_LERP(value::texcoord2f)
  DO_LERP(value::texcoord2d)
  DO_LERP(value::texcoord3h)
  DO_LERP(value::texcoord3f)
  DO_LERP(value::texcoord3d)
  {
    DCOUT("TODO: type " << GetTypeName(tyid));
  }

#undef DO_LERP

  if (ok) {
    (*dst) = result;
  }

  return ok;
}